

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_union(lyd_node_leaf_list *leaf,lys_type *type,int store,int ignore_fail,
                 lys_type **resolved_type)

{
  ushort uVar1;
  int iVar2;
  uint8_t *puVar3;
  lys_type *prev_type;
  lys_type *plVar4;
  char *pcVar5;
  int iVar6;
  int req_inst;
  lyd_val lVar7;
  bool bVar8;
  lyd_node *local_58;
  lyd_node *ret;
  int local_48;
  int local_44;
  int found;
  uint8_t local_31;
  
  local_44 = ignore_fail;
  if (type->base != LY_TYPE_UNION) {
    __assert_fail("type->base == LY_TYPE_UNION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x1d32,
                  "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                 );
  }
  uVar1 = leaf->value_type;
  if ((uVar1 == 0x88) || (uVar1 == 0xb)) {
    _found = leaf->value;
  }
  else {
    _found = (char *)0x0;
  }
  if (store != 0) {
    if ((uVar1 & 0x3f) == 2) {
      free((leaf->value).binary);
    }
    (leaf->value).binary = (char *)0x0;
  }
  puVar3 = ly_vlog_hide_location();
  local_31 = *puVar3;
  ly_vlog_hide('\x01');
  local_48 = 0;
  ret = (lyd_node *)&leaf->value_str;
  prev_type = (lys_type *)0x0;
  while (prev_type = lyp_get_next_union_type(type,prev_type,&local_48), iVar6 = local_44,
        lVar7 = _found, prev_type != (lys_type *)0x0) {
    local_48 = 0;
    if (prev_type->base == LY_TYPE_INST) {
      if (_found == (char *)0x0) {
        lVar7 = (lyd_val)ret->schema;
      }
      bVar8 = local_44 != 2;
      iVar2 = check_instid_ext_dep(leaf->schema,lVar7.binary);
      req_inst = -1;
      if ((iVar6 != 1) && (bVar8 || iVar2 == 0)) {
        req_inst = (int)(prev_type->info).inst.req;
      }
      lVar7 = _found;
      if (_found == (char *)0x0) {
        lVar7 = (lyd_val)ret->schema;
      }
      iVar6 = resolve_instid((lyd_node *)leaf,lVar7.binary,req_inst,&local_58);
      lVar7 = _found;
      bVar8 = iVar6 != 0;
      if ((store != 0) && (iVar6 == 0)) {
        if ((local_58 == (lyd_node *)0x0) || (iVar2 != 0)) {
          (leaf->value).binary = (char *)_found;
          leaf->value_type = 0x88;
        }
        else {
          (leaf->value).binary = (char *)local_58;
          leaf->value_type = 8;
          if (_found != (char *)0x0) {
            lydict_remove(leaf->schema->module->ctx,leaf->value_str);
            leaf->value_str = (char *)lVar7;
          }
        }
        lVar7.binary = (char *)0x0;
        break;
      }
LAB_0011aa47:
      lVar7 = _found;
      if (!bVar8) break;
    }
    else {
      if (prev_type->base == LY_TYPE_LEAFREF) {
        iVar6 = -1;
        if ((local_44 != 1) && ((local_44 != 2 || ((leaf->schema->flags & 0x400) == 0)))) {
          iVar6 = (int)(prev_type->info).lref.req;
        }
        iVar6 = resolve_leafref(leaf,(prev_type->info).lref.path,iVar6,&local_58);
        bVar8 = iVar6 != 0;
        if ((store == 0) || (iVar6 != 0)) goto LAB_0011aa47;
        if ((local_58 == (lyd_node *)0x0) || ((leaf->schema->flags & 0x400) != 0)) {
          plVar4 = lyp_parse_value(prev_type,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,1,0
                                  );
          lVar7 = _found;
          if (plVar4 == (lys_type *)0x0) {
            return -1;
          }
        }
        else {
          (leaf->value).binary = (char *)local_58;
          leaf->value_type = 9;
          lVar7 = _found;
        }
        break;
      }
      plVar4 = lyp_parse_value(prev_type,(char **)ret,(lyxml_elem *)0x0,leaf,(lyd_attr *)0x0,store,0
                              );
      lVar7 = _found;
      if (plVar4 != (lys_type *)0x0) break;
    }
    ly_err_clean(1);
    if (store != 0) {
      if (prev_type->base == LY_TYPE_BITS) {
        free((leaf->value).binary);
      }
      (leaf->value).binary = (char *)0x0;
    }
  }
  if (local_31 == '\0') {
    ly_vlog_hide('\0');
  }
  if (lVar7.binary == (char *)0x0) {
    if (prev_type == (lys_type *)0x0) goto LAB_0011ab12;
  }
  else {
    if (prev_type == (lys_type *)0x0) {
      if (leaf->value_type != 0xb) {
        __assert_fail("leaf->value_type == LY_TYPE_UNION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                      ,0x1da6,
                      "int resolve_union(struct lyd_node_leaf_list *, struct lys_type *, int, int, struct lys_type **)"
                     );
      }
      (leaf->value).binary = (char *)lVar7;
LAB_0011ab12:
      if ((local_44 != 0) && ((type->info).uni.has_ptr_type != 0)) {
        return 0;
      }
      pcVar5 = "";
      if (leaf->value_str != (char *)0x0) {
        pcVar5 = leaf->value_str;
      }
      ly_vlog(LYE_INVAL,LY_VLOG_LYD,leaf,pcVar5,leaf->schema->name);
      return 1;
    }
    lydict_remove(leaf->schema->module->ctx,lVar7.binary);
  }
  if (resolved_type != (lys_type **)0x0) {
    *resolved_type = prev_type;
  }
  return 0;
}

Assistant:

int
resolve_union(struct lyd_node_leaf_list *leaf, struct lys_type *type, int store, int ignore_fail,
              struct lys_type **resolved_type)
{
    struct lys_type *t;
    struct lyd_node *ret;
    int found, hidden, success = 0, ext_dep, req_inst;
    const char *json_val = NULL;

    assert(type->base == LY_TYPE_UNION);

    if ((leaf->value_type == LY_TYPE_UNION) || (leaf->value_type == (LY_TYPE_INST | LY_TYPE_INST_UNRES))) {
        /* either NULL or instid previously converted to JSON */
        json_val = leaf->value.string;
    }

    if (store) {
        if ((leaf->value_type & LY_DATA_TYPE_MASK) == LY_TYPE_BITS) {
            free(leaf->value.bit);
        }
        memset(&leaf->value, 0, sizeof leaf->value);
    }

    /* turn logging off, we are going to try to validate the value with all the types in order */
    hidden = *ly_vlog_hide_location();
    ly_vlog_hide(1);

    t = NULL;
    found = 0;
    while ((t = lyp_get_next_union_type(type, t, &found))) {
        found = 0;

        switch (t->base) {
        case LY_TYPE_LEAFREF:
            if ((ignore_fail == 1) || ((leaf->schema->flags & LYS_LEAFREF_DEP) && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.lref.req;
            }

            if (!resolve_leafref(leaf, t->info.lref.path, req_inst, &ret)) {
                if (store) {
                    if (ret && !(leaf->schema->flags & LYS_LEAFREF_DEP)) {
                        /* valid resolved */
                        leaf->value.leafref = ret;
                        leaf->value_type = LY_TYPE_LEAFREF;
                    } else {
                        /* valid unresolved */
                        if (!lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, 1, 0)) {
                            return -1;
                        }
                    }
                }

                success = 1;
            }
            break;
        case LY_TYPE_INST:
            ext_dep = check_instid_ext_dep(leaf->schema, (json_val ? json_val : leaf->value_str));
            if ((ignore_fail == 1) || (ext_dep && (ignore_fail == 2))) {
                req_inst = -1;
            } else {
                req_inst = t->info.inst.req;
            }

            if (!resolve_instid((struct lyd_node *)leaf, (json_val ? json_val : leaf->value_str), req_inst, &ret)) {
                if (store) {
                    if (ret && !ext_dep) {
                        /* valid resolved */
                        leaf->value.instance = ret;
                        leaf->value_type = LY_TYPE_INST;

                        if (json_val) {
                            lydict_remove(leaf->schema->module->ctx, leaf->value_str);
                            leaf->value_str = json_val;
                            json_val = NULL;
                        }
                    } else {
                        /* valid unresolved */
                        if (json_val) {
                            /* put the JSON val back */
                            leaf->value.string = json_val;
                            json_val = NULL;
                        } else {
                            leaf->value.instance = NULL;
                        }
                        leaf->value_type = LY_TYPE_INST | LY_TYPE_INST_UNRES;
                    }
                }

                success = 1;
            }
            break;
        default:
            if (lyp_parse_value(t, &leaf->value_str, NULL, leaf, NULL, store, 0)) {
                success = 1;
            }
            break;
        }

        if (success) {
            break;
        }

        /* erase information about errors - they are false or irrelevant
         * and will be replaced by a single error messages */
        ly_err_clean(1);

        /* erase possible present and invalid value data */
        if (store) {
            if (t->base == LY_TYPE_BITS) {
                free(leaf->value.bit);
            }
            memset(&leaf->value, 0, sizeof leaf->value);
        }
    }

    /* turn logging back on */
    if (!hidden) {
        ly_vlog_hide(0);
    }

    if (json_val) {
        if (!success) {
            /* put the value back for now */
            assert(leaf->value_type == LY_TYPE_UNION);
            leaf->value.string = json_val;
        } else {
            /* value was ultimately useless, but we could not have known */
            lydict_remove(leaf->schema->module->ctx, json_val);
        }
    }

    if (success) {
        if (resolved_type) {
            *resolved_type = t;
        }
    } else if (!ignore_fail || !type->info.uni.has_ptr_type) {
        /* not found and it is required */
        LOGVAL(LYE_INVAL, LY_VLOG_LYD, leaf, leaf->value_str ? leaf->value_str : "", leaf->schema->name);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;

}